

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O1

pair<unsigned_long,_unsigned_long> __thiscall
google::
sparse_hashtable<std::pair<char_const*const,ValueType>,char_const*,Hasher,google::sparse_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SelectKey,google::sparse_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
::find_position<char_const*>
          (sparse_hashtable<std::pair<char_const*const,ValueType>,char_const*,Hasher,google::sparse_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SelectKey,google::sparse_hash_map<char_const*,ValueType,Hasher,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
           *this,char **key)

{
  long lVar1;
  bool bVar2;
  char *pcVar3;
  const_reference b;
  char cVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  pair<unsigned_long,_unsigned_long> pVar10;
  
  lVar1 = *(long *)(this + 0x88);
  pcVar3 = *key;
  *(int *)(this + 4) = *(int *)(this + 4) + 1;
  cVar4 = *pcVar3;
  if (cVar4 == '\0') {
    uVar6 = 0;
  }
  else {
    uVar6 = 0;
    do {
      pcVar3 = pcVar3 + 1;
      uVar6 = (long)cVar4 + uVar6 * 0x21;
      cVar4 = *pcVar3;
    } while (cVar4 != '\0');
    uVar6 = uVar6 >> 3;
  }
  uVar9 = 0xffffffffffffffff;
  lVar7 = 0;
  do {
    uVar6 = uVar6 & lVar1 - 1U;
    uVar5 = uVar6 % 0x30;
    lVar8 = (uVar6 / 0x30) * 0x28;
    if ((*(byte *)((uVar5 >> 3) + 0x20 + *(long *)(this + 0x60) + lVar8) >> ((uint)uVar5 & 7) & 1)
        == 0) {
      uVar5 = uVar6;
      if (uVar9 != 0xffffffffffffffff) {
        uVar5 = uVar9;
      }
      uVar6 = 0xffffffffffffffff;
LAB_00647a8b:
      pVar10.second = uVar5;
      pVar10.first = uVar6;
      return pVar10;
    }
    bVar2 = sparse_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
            ::test_deleted((sparse_hashtable<std::pair<const_char_*const,_ValueType>,_const_char_*,_Hasher,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
                            *)this,uVar6);
    if (bVar2) {
      if (uVar9 == 0xffffffffffffffff) {
        uVar9 = uVar6;
      }
    }
    else {
      b = sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
          ::unsafe_get((sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>
                        *)(lVar8 + *(long *)(this + 0x60)),(size_type_conflict)uVar5);
      bVar2 = KeyInfo::equals<char_const*,char_const*>((KeyInfo *)(this + 0x30),key,&b->first);
      if (bVar2) {
        uVar5 = 0xffffffffffffffff;
        goto LAB_00647a8b;
      }
    }
    uVar6 = uVar6 + lVar7 + 1;
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

std::pair<size_type, size_type> find_position(const K& key) const {
    size_type num_probes = 0;  // how many times we've probed
    const size_type bucket_count_minus_one = bucket_count() - 1;
    size_type bucknum = hash(key) & bucket_count_minus_one;
    size_type insert_pos = ILLEGAL_BUCKET;  // where we would insert
    SPARSEHASH_STAT_UPDATE(total_lookups += 1);
    while (1) {                    // probe until something happens
      if (!table.test(bucknum)) {  // bucket is empty
        SPARSEHASH_STAT_UPDATE(total_probes += num_probes);
        if (insert_pos == ILLEGAL_BUCKET)  // found no prior place to insert
          return std::pair<size_type, size_type>(ILLEGAL_BUCKET, bucknum);
        else
          return std::pair<size_type, size_type>(ILLEGAL_BUCKET, insert_pos);
      } else if (test_deleted(bucknum)) {  // keep searching, but mark to insert
        if (insert_pos == ILLEGAL_BUCKET) insert_pos = bucknum;
      } else if (equals(key, get_key(table.unsafe_get(bucknum)))) {
        SPARSEHASH_STAT_UPDATE(total_probes += num_probes);
        return std::pair<size_type, size_type>(bucknum, ILLEGAL_BUCKET);
      }
      ++num_probes;  // we're doing another probe
      bucknum = (bucknum + JUMP_(key, num_probes)) & bucket_count_minus_one;
      assert(num_probes < bucket_count() &&
             "Hashtable is full: an error in key_equal<> or hash<>");
    }
  }